

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O3

void agent_cancel_query(agent_pending_query *conn)

{
  char *ptr;
  undefined8 unaff_RBX;
  
  uxsel_del((int)((ulong)unaff_RBX >> 0x20));
  close(conn->fd);
  del234(agent_pending_queries,conn);
  ptr = conn->retbuf;
  if (ptr != conn->sizebuf && ptr != (char *)0x0) {
    safefree(ptr);
  }
  safefree(conn);
  return;
}

Assistant:

void agent_cancel_query(agent_pending_query *conn)
{
    uxsel_del(conn->fd);
    close(conn->fd);
    del234(agent_pending_queries, conn);
    if (conn->retbuf && conn->retbuf != conn->sizebuf)
        sfree(conn->retbuf);
    sfree(conn);
}